

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedMessageFieldGenerator::GenerateBuildingCode
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedMessageFieldGenerator *this_local;
  
  PrintNestedBuilderCondition
            (this,printer,
             "if ($get_mutable_bit_builder$) {\n  $name$_ = java.util.Collections.unmodifiableList($name$_);\n  $clear_mutable_bit_builder$;\n}\nresult.$name$_ = $name$_;\n"
             ,"result.$name$_ = $name$Builder_.build();\n");
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateBuildingCode(io::Printer* printer) const {
  // The code below (non-nested builder case) ensures that the result has an
  // immutable list. If our list is immutable, we can just reuse it. If not,
  // we make it immutable.
  PrintNestedBuilderCondition(printer,
    "if ($get_mutable_bit_builder$) {\n"
    "  $name$_ = java.util.Collections.unmodifiableList($name$_);\n"
    "  $clear_mutable_bit_builder$;\n"
    "}\n"
    "result.$name$_ = $name$_;\n",

    "result.$name$_ = $name$Builder_.build();\n");
}